

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O3

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,RegVmLoweredInstruction *instruction)

{
  uchar uVar1;
  uint uVar2;
  VariableData *pVVar3;
  RegVmLoweredInstruction *pRVar4;
  uchar *puVar5;
  uchar *puVar6;
  RegVmLoweredInstruction **ppRVar7;
  RegVmLoweredFunction *pRVar8;
  char *__function;
  ulong uVar9;
  
  if (instruction == (RegVmLoweredInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x1e,
                  "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
                 );
  }
  if (instruction->parent != (RegVmLoweredBlock *)0x0) {
    __assert_fail("instruction->parent == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x1f,
                  "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
                 );
  }
  if (instruction->prevSibling != (RegVmLoweredInstruction *)0x0) {
    __assert_fail("instruction->prevSibling == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x20,
                  "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
                 );
  }
  if (instruction->nextSibling != (RegVmLoweredInstruction *)0x0) {
    __assert_fail("instruction->nextSibling == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x21,
                  "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
                 );
  }
  instruction->parent = this;
  if ((instruction->argument != (VmConstant *)0x0) &&
     (pVVar3 = instruction->argument->container, pVVar3 != (VariableData *)0x0)) {
    uVar2 = (pVVar3->regVmUsers).count;
    if (uVar2 == (pVVar3->regVmUsers).max) {
      SmallArray<RegVmLoweredInstruction_*,_4U>::grow(&pVVar3->regVmUsers,uVar2);
    }
    ppRVar7 = (pVVar3->regVmUsers).data;
    if (ppRVar7 == (RegVmLoweredInstruction **)0x0) {
      __function = 
      "void SmallArray<RegVmLoweredInstruction *, 4>::push_back(const T &) [T = RegVmLoweredInstruction *, N = 4]"
      ;
LAB_002623a6:
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,__function);
    }
    uVar2 = (pVVar3->regVmUsers).count;
    (pVVar3->regVmUsers).count = uVar2 + 1;
    ppRVar7[uVar2] = instruction;
  }
  ppRVar7 = &this->lastInstruction;
  if (this->firstInstruction == (RegVmLoweredInstruction *)0x0) {
    *ppRVar7 = instruction;
    ppRVar7 = &this->firstInstruction;
  }
  else {
    pRVar4 = *ppRVar7;
    pRVar4->nextSibling = instruction;
    instruction->prevSibling = pRVar4;
  }
  *ppRVar7 = instruction;
  pRVar8 = this->parent;
  if ((pRVar8->killedRegisters).count != 0) {
    uVar9 = 0;
    do {
      puVar5 = (pRVar8->killedRegisters).data;
      uVar2 = (instruction->preKillRegisters).count;
      if (uVar2 == (instruction->preKillRegisters).max) {
        SmallArray<unsigned_char,_8U>::grow(&instruction->preKillRegisters,uVar2);
      }
      puVar6 = (instruction->preKillRegisters).data;
      if (puVar6 == (uchar *)0x0) {
        __function = 
        "void SmallArray<unsigned char, 8>::push_back(const T &) [T = unsigned char, N = 8]";
        goto LAB_002623a6;
      }
      uVar1 = puVar5[uVar9];
      uVar2 = (instruction->preKillRegisters).count;
      (instruction->preKillRegisters).count = uVar2 + 1;
      puVar6[uVar2] = uVar1;
      uVar9 = uVar9 + 1;
      pRVar8 = this->parent;
    } while (uVar9 < (pRVar8->killedRegisters).count);
  }
  (pRVar8->killedRegisters).count = 0;
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, RegVmLoweredInstruction* instruction)
{
	(void)ctx;

	assert(instruction);
	assert(instruction->parent == NULL);
	assert(instruction->prevSibling == NULL);
	assert(instruction->nextSibling == NULL);

	instruction->parent = this;

	if(instruction->argument && instruction->argument->container)
		instruction->argument->container->regVmUsers.push_back(instruction);

	if(!firstInstruction)
	{
		firstInstruction = lastInstruction = instruction;
	}
	else
	{
		lastInstruction->nextSibling = instruction;
		instruction->prevSibling = lastInstruction;

		lastInstruction = instruction;
	}

	for(unsigned i = 0; i < parent->killedRegisters.size(); i++)
		instruction->preKillRegisters.push_back(parent->killedRegisters[i]);
	parent->killedRegisters.clear();
}